

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O3

PHYSFS_Io * SZIP_openRead(void *opaque,char *path)

{
  uint uVar1;
  uint folderIndex;
  ulong outSize;
  long lVar2;
  long lVar3;
  SRes rc;
  UInt32 UVar4;
  PHYSFS_ErrorCode errcode;
  void *pvVar5;
  long lVar6;
  Byte *outBuffer;
  PHYSFS_Io *pPVar7;
  ulong uVar8;
  ulong uVar9;
  PHYSFS_uint64 __n;
  long lVar10;
  SZIPLookToRead stream;
  ISzAlloc *in_stack_ffffffffffffbf78;
  code *local_4080;
  code *local_4078;
  long local_4070;
  ILookInStream local_4068;
  code **local_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  
  pvVar5 = __PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,path);
  if (pvVar5 == (void *)0x0) {
    return (PHYSFS_Io *)0x0;
  }
  if (*(int *)((long)pvVar5 + 0x20) != 0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_NOT_A_FILE);
    return (PHYSFS_Io *)0x0;
  }
  lVar6 = (**(code **)(*(long *)((long)opaque + 0x20) + 0x38))();
  if (lVar6 == 0) {
    return (PHYSFS_Io *)0x0;
  }
  local_4048 = &local_4080;
  local_4080 = SZIP_ISeekInStream_Read;
  local_4078 = SZIP_ISeekInStream_Seek;
  local_4040 = 0;
  uStack_4038 = 0;
  local_4068.Look = LookToRead_Look_Exact;
  local_4068.Skip = LookToRead_Skip;
  local_4068.Read = LookToRead_Read;
  local_4068.Seek = LookToRead_Seek;
  uVar1 = *(uint *)((long)pvVar5 + 0x28);
  uVar8 = (ulong)uVar1;
  folderIndex = *(uint *)(*(long *)((long)opaque + 0xe8) + uVar8 * 4);
  uVar9 = (ulong)folderIndex;
  local_4070 = lVar6;
  if (uVar9 == 0xffffffff) {
    outBuffer = (Byte *)0x0;
    (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(void *)0x0);
    lVar10 = 0;
    __n = 0;
    goto LAB_0010d9d1;
  }
  outSize = *(ulong *)(*(long *)((long)opaque + 0x68) +
                      (ulong)((uint)*(byte *)(*(long *)((long)opaque + 0x60) + uVar9) +
                             *(int *)(*(long *)((long)opaque + 0x58) + uVar9 * 4)) * 8);
  outBuffer = (Byte *)0x0;
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(void *)0x0);
  if ((outSize == 0) ||
     (outBuffer = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,outSize), outBuffer != (Byte *)0x0)) {
    rc = SzAr_DecodeFolder((CSzAr *)((long)opaque + 0x28),folderIndex,&local_4068,
                           *(UInt64 *)((long)opaque + 0x80),outBuffer,outSize,
                           in_stack_ffffffffffffbf78);
    if (rc == 0) {
      lVar10 = *(long *)((long)opaque + 0x90);
      lVar2 = *(long *)(lVar10 + (ulong)*(uint *)(*(long *)((long)opaque + 0xe0) + uVar9 * 4) * 8);
      lVar3 = *(long *)(lVar10 + (ulong)(uVar1 + 1) * 8);
      rc = 0xb;
      if ((ulong)(lVar3 - lVar2) <= outSize) {
        lVar10 = *(long *)(lVar10 + uVar8 * 8);
        __n = lVar3 - lVar10;
        lVar10 = lVar10 - lVar2;
        if ((*(long *)((long)opaque + 0xa0) != 0) &&
           ((char)(*(char *)(*(long *)((long)opaque + 0xa0) + (ulong)(uVar1 >> 3)) <<
                  ((byte)uVar1 & 7)) < '\0')) {
          UVar4 = (*g_CrcUpdate)(0xffffffff,outBuffer + lVar10,__n,g_CrcTable);
          rc = 3;
          if ((UVar4 ^ *(uint *)(*(long *)((long)opaque + 0xa8) + uVar8 * 4)) != 0xffffffff)
          goto LAB_0010dacf;
        }
LAB_0010d9d1:
        (**(code **)(lVar6 + 0x48))(lVar6);
        pvVar5 = (*__PHYSFS_AllocatorHooks.Malloc)(__n);
        memcpy(pvVar5,outBuffer + lVar10,__n);
        (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,outBuffer);
        pPVar7 = __PHYSFS_createMemoryIo(pvVar5,__n,__PHYSFS_AllocatorHooks.Free);
        if (pPVar7 != (PHYSFS_Io *)0x0) {
          return pPVar7;
        }
        if (pvVar5 == (void *)0x0) {
          return (PHYSFS_Io *)0x0;
        }
        (*__PHYSFS_AllocatorHooks.Free)(pvVar5);
        return (PHYSFS_Io *)0x0;
      }
    }
  }
  else {
    rc = 2;
    outBuffer = (Byte *)0x0;
  }
LAB_0010dacf:
  errcode = szipErrorCode(rc);
  PHYSFS_setErrorCode(errcode);
  (**(code **)(lVar6 + 0x48))(lVar6);
  if (outBuffer != (Byte *)0x0) {
    (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,outBuffer);
  }
  return (PHYSFS_Io *)0x0;
}

Assistant:

static PHYSFS_Io *SZIP_openRead(void *opaque, const char *path)
{
    /* !!! FIXME: the current lzma sdk C API only allows you to decompress
       !!! FIXME:  the entire file at once, which isn't ideal. Fix this in the
       !!! FIXME:  SDK and then convert this all to a streaming interface. */

    SZIPinfo *info = (SZIPinfo *) opaque;
    SZIPentry *entry = (SZIPentry *) __PHYSFS_DirTreeFind(&info->tree, path);
    ISzAlloc *alloc = &SZIP_SzAlloc;
    SZIPLookToRead stream;
    PHYSFS_Io *retval = NULL;
    PHYSFS_Io *io = NULL;
    UInt32 blockIndex = 0xFFFFFFFF;
    Byte *outBuffer = NULL;
    size_t outBufferSize = 0;
    size_t offset = 0;
    size_t outSizeProcessed = 0;
    void *buf = NULL;
    SRes rc;

    BAIL_IF_ERRPASS(!entry, NULL);
    BAIL_IF(entry->tree.isdir, PHYSFS_ERR_NOT_A_FILE, NULL);

    io = info->io->duplicate(info->io);
    GOTO_IF_ERRPASS(!io, SZIP_openRead_failed);

    szipInitStream(&stream, io);

    rc = SzArEx_Extract(&info->db, &stream.lookStream.s, entry->dbidx,
                        &blockIndex, &outBuffer, &outBufferSize, &offset,
                        &outSizeProcessed, alloc, alloc);
    GOTO_IF(rc != SZ_OK, szipErrorCode(rc), SZIP_openRead_failed);

    io->destroy(io);
    io = NULL;

    buf = allocator.Malloc(outSizeProcessed);
    GOTO_IF(rc != SZ_OK, PHYSFS_ERR_OUT_OF_MEMORY, SZIP_openRead_failed);
    memcpy(buf, outBuffer + offset, outSizeProcessed);

    alloc->Free(alloc, outBuffer);
    outBuffer = NULL;

    retval = __PHYSFS_createMemoryIo(buf, outSizeProcessed, allocator.Free);
    GOTO_IF_ERRPASS(!retval, SZIP_openRead_failed);

    return retval;

SZIP_openRead_failed:
    if (io != NULL)
        io->destroy(io);

    if (buf)
        allocator.Free(buf);

    if (outBuffer)
        alloc->Free(alloc, outBuffer);

    return NULL;
}